

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_TEXM3X3SPEC(Context *ctx)

{
  uint regnum;
  RegisterList *pRVar1;
  size_t in_RDX;
  size_t buflen;
  size_t buflen_00;
  size_t in_R8;
  char *pcVar2;
  char src5 [64];
  char tmp2 [64];
  char tmp [64];
  char src4 [64];
  char src3 [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  
  if (ctx->texm3x3pad_src1 != -1) {
    regnum = (ctx->dest_arg).regnum;
    allocate_ARB1_scratch_reg_name(ctx,tmp,in_RDX);
    allocate_ARB1_scratch_reg_name(ctx,tmp2,buflen);
    get_D3D_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_dst0,src0,in_R8);
    get_D3D_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_src0,src1,in_R8);
    get_D3D_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_dst1,src2,in_R8);
    get_D3D_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_src1,src3,in_R8);
    get_D3D_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->source_args[0].regnum,src4,in_R8);
    get_D3D_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->source_args[1].regnum,src5,in_R8);
    get_ARB1_destarg_varname(ctx,dst,buflen_00);
    pRVar1 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,regnum);
    if (pRVar1 == (RegisterList *)0x0) {
      pcVar2 = "3D";
    }
    else {
      pcVar2 = "3D";
      if (pRVar1->index == 3) {
        pcVar2 = "CUBE";
      }
    }
    output_line(ctx,"DP3 %s.z, %s, %s;",dst,dst,src4);
    output_line(ctx,"DP3 %s.x, %s, %s;",dst,src0,src1);
    output_line(ctx,"DP3 %s.y, %s, %s;",dst,src2,src3);
    output_line(ctx,"MUL %s, %s, %s;",tmp,dst,dst);
    output_line(ctx,"MUL %s, %s, %s;",tmp2,dst,src5);
    output_line(ctx,"RCP %s.x, %s.x;",tmp2,tmp2);
    output_line(ctx,"RCP %s.y, %s.y;",tmp2,tmp2);
    output_line(ctx,"RCP %s.z, %s.z;",tmp2,tmp2);
    output_line(ctx,"RCP %s.w, %s.w;",tmp2,tmp2);
    output_line(ctx,"MUL %s, %s, %s;",tmp,tmp,tmp2);
    output_line(ctx,"MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };",tmp,tmp);
    output_line(ctx,"MAD %s, %s, %s, -%s;",tmp,tmp,dst,src5);
    output_line(ctx,"TEX %s, %s, texture[%d], %s;",dst,tmp,(ulong)regnum,pcVar2);
    emit_ARB1_dest_modifiers(ctx);
  }
  return;
}

Assistant:

static void emit_ARB1_TEXM3X3SPEC(Context *ctx)
{
    if (ctx->texm3x3pad_src1 == -1)
        return;

    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];
    char src3[64];
    char src4[64];
    char src5[64];
    char tmp[64];
    char tmp2[64];

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    const int stage = ctx->dest_arg.regnum;
    allocate_ARB1_scratch_reg_name(ctx, tmp, sizeof (tmp));
    allocate_ARB1_scratch_reg_name(ctx, tmp2, sizeof (tmp2));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst0,
                            src0, sizeof (src0));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src0,
                            src1, sizeof (src1));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst1,
                            src2, sizeof (src2));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src1,
                            src3, sizeof (src3));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src4, sizeof (src4));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[1].regnum,
                            src5, sizeof (src5));
    get_ARB1_destarg_varname(ctx, dst, sizeof (dst));

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, stage);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);
    const char *ttypestr = (ttype == TEXTURE_TYPE_CUBE) ? "CUBE" : "3D";

    output_line(ctx, "DP3 %s.z, %s, %s;", dst, dst, src4);
    output_line(ctx, "DP3 %s.x, %s, %s;", dst, src0, src1);
    output_line(ctx, "DP3 %s.y, %s, %s;", dst, src2, src3);
    output_line(ctx, "MUL %s, %s, %s;", tmp, dst, dst);    // normal * normal
    output_line(ctx, "MUL %s, %s, %s;", tmp2, dst, src5);  // normal * eyeray

    // !!! FIXME: This is goofy. There's got to be a way to do vector-wide
    // !!! FIXME:  divides or reciprocals...right?
    output_line(ctx, "RCP %s.x, %s.x;", tmp2, tmp2);
    output_line(ctx, "RCP %s.y, %s.y;", tmp2, tmp2);
    output_line(ctx, "RCP %s.z, %s.z;", tmp2, tmp2);
    output_line(ctx, "RCP %s.w, %s.w;", tmp2, tmp2);
    output_line(ctx, "MUL %s, %s, %s;", tmp, tmp, tmp2);

    output_line(ctx, "MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };", tmp, tmp);
    output_line(ctx, "MAD %s, %s, %s, -%s;", tmp, tmp, dst, src5);
    output_line(ctx, "TEX %s, %s, texture[%d], %s;", dst, tmp, stage, ttypestr);
    emit_ARB1_dest_modifiers(ctx);
}